

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.cpp
# Opt level: O1

void __thiscall DeflateEncoder::run(DeflateEncoder *this)

{
  pointer pcVar1;
  HuffmanEncoder huffman;
  Lz77Encoder lz77;
  string local_160;
  long *local_140 [2];
  long local_130 [2];
  undefined1 local_120 [40];
  _Alloc_hider local_f8;
  size_type local_f0;
  _List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_> local_d0;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  Cryptor local_68;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Deflate encryption...",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  pcVar1 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
  local_120._0_8_ = local_120 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,pcVar1,pcVar1 + (this->super_Cryptor).in_message_._M_string_length)
  ;
  Lz77Encoder::Lz77Encoder((Lz77Encoder *)&local_68,(string *)local_120);
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  Lz77Encoder::run((Lz77Encoder *)&local_68);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_68.out_message_._M_dataplus._M_p,
             local_68.out_message_._M_dataplus._M_p + local_68.out_message_._M_string_length);
  HuffmanEncoder::HuffmanEncoder((HuffmanEncoder *)local_120,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  HuffmanEncoder::run((HuffmanEncoder *)local_120);
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,local_f8._M_p,local_f8._M_p + local_f0);
  std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,(string *)local_140)
  ;
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"encryption done",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::
  _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  std::__cxx11::
  _List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::_M_clear
            (&local_d0);
  Cryptor::~Cryptor((Cryptor *)local_120);
  Cryptor::~Cryptor(&local_68);
  return;
}

Assistant:

void DeflateEncoder::run() {
  cout << "Deflate encryption..." << endl;

  Lz77Encoder lz77(get_in_message());
  lz77.run();
  HuffmanEncoder huffman(lz77.get_out_message());
  huffman.run();
  set_out_message(huffman.get_out_message());

  cout << "encryption done" << endl;
}